

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

void getPixelColorsRGBA8(uchar *buffer,size_t numpixels,uint has_alpha,uchar *in,
                        LodePNGColorMode *mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uchar uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  uchar *puVar10;
  byte *pbVar11;
  uchar *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  
  uVar4 = 4 - (has_alpha == 0);
  switch(mode->colortype) {
  case LCT_GREY:
    uVar13 = mode->bitdepth;
    if (uVar13 == 8) {
      if (numpixels != 0) {
        puVar10 = buffer + 3;
        sVar7 = 0;
        do {
          uVar6 = in[sVar7];
          puVar10[-1] = uVar6;
          puVar10[-2] = uVar6;
          puVar10[-3] = uVar6;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar6 = 0xff;
            }
            else {
              uVar6 = -(mode->key_r != (uint)in[sVar7]);
            }
            *puVar10 = uVar6;
          }
          sVar7 = sVar7 + 1;
          puVar10 = puVar10 + uVar4;
        } while (numpixels != sVar7);
      }
    }
    else if (uVar13 == 0x10) {
      if (numpixels != 0) {
        puVar10 = buffer + 3;
        sVar7 = 0;
        do {
          uVar6 = in[sVar7 * 2];
          puVar10[-1] = uVar6;
          puVar10[-2] = uVar6;
          puVar10[-3] = uVar6;
          if (has_alpha != 0) {
            if (mode->key_defined == 0) {
              uVar6 = 0xff;
            }
            else {
              uVar6 = -((uint)(ushort)(*(ushort *)(in + sVar7 * 2) << 8 |
                                      *(ushort *)(in + sVar7 * 2) >> 8) != mode->key_r);
            }
            *puVar10 = uVar6;
          }
          sVar7 = sVar7 + 1;
          puVar10 = puVar10 + uVar4;
        } while (numpixels != sVar7);
      }
    }
    else if (numpixels != 0) {
      sVar7 = 0;
      uVar8 = 0;
      do {
        uVar5 = (ulong)mode->bitdepth;
        uVar16 = 0;
        uVar9 = uVar5;
        uVar15 = uVar8;
        if (uVar5 != 0) {
          do {
            uVar16 = (uint)((in[uVar15 >> 3] >> (~(byte)uVar15 & 7) & 1) != 0) + uVar16 * 2;
            uVar9 = uVar9 - 1;
            uVar15 = uVar15 + 1;
          } while (uVar9 != 0);
          uVar8 = uVar8 + uVar5;
        }
        uVar6 = (uchar)((uVar16 * 0xff) / (uint)~(-1 << ((byte)uVar13 & 0x1f)));
        buffer[2] = uVar6;
        buffer[1] = uVar6;
        *buffer = uVar6;
        if (has_alpha != 0) {
          if (mode->key_defined == 0) {
            uVar6 = 0xff;
          }
          else {
            uVar6 = -(uVar16 != mode->key_r);
          }
          buffer[3] = uVar6;
        }
        sVar7 = sVar7 + 1;
        buffer = buffer + uVar4;
      } while (sVar7 != numpixels);
    }
    break;
  case LCT_RGB:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar10 = buffer + 3;
        pbVar11 = in + 2;
        do {
          bVar1 = pbVar11[-2];
          puVar10[-3] = bVar1;
          bVar2 = pbVar11[-1];
          puVar10[-2] = bVar2;
          bVar3 = *pbVar11;
          puVar10[-1] = bVar3;
          if (has_alpha != 0) {
            uVar6 = 0xff;
            if (((mode->key_defined != 0) && (mode->key_r == (uint)bVar1)) &&
               (mode->key_g == (uint)bVar2)) {
              uVar6 = -(mode->key_b != (uint)bVar3);
            }
            *puVar10 = uVar6;
          }
          puVar10 = puVar10 + uVar4;
          pbVar11 = pbVar11 + 3;
          numpixels = numpixels - 1;
        } while (numpixels != 0);
      }
    }
    else if (numpixels != 0) {
      puVar10 = buffer + 3;
      puVar12 = in + 5;
      do {
        puVar10[-3] = puVar12[-5];
        puVar10[-2] = puVar12[-3];
        puVar10[-1] = puVar12[-1];
        if (has_alpha != 0) {
          uVar6 = 0xff;
          if (((mode->key_defined != 0) &&
              ((uint)(ushort)(*(ushort *)(puVar12 + -5) << 8 | *(ushort *)(puVar12 + -5) >> 8) ==
               mode->key_r)) &&
             ((uint)(ushort)(*(ushort *)(puVar12 + -3) << 8 | *(ushort *)(puVar12 + -3) >> 8) ==
              mode->key_g)) {
            uVar6 = -((uint)(ushort)(*(ushort *)(puVar12 + -1) << 8 | *(ushort *)(puVar12 + -1) >> 8
                                    ) != mode->key_b);
          }
          *puVar10 = uVar6;
        }
        puVar10 = puVar10 + uVar4;
        puVar12 = puVar12 + 6;
        numpixels = numpixels - 1;
      } while (numpixels != 0);
    }
    break;
  case LCT_PALETTE:
    if (numpixels != 0) {
      sVar7 = 0;
      uVar8 = 0;
      do {
        uVar9 = (ulong)mode->bitdepth;
        if (uVar9 == 8) {
          uVar14 = (ulong)in[sVar7];
        }
        else {
          uVar14 = 0;
          uVar15 = uVar9;
          uVar5 = uVar8;
          if (uVar9 != 0) {
            do {
              uVar14 = (ulong)((uint)((in[uVar5 >> 3] >> (~(byte)uVar5 & 7) & 1) != 0) +
                              (int)uVar14 * 2);
              uVar15 = uVar15 - 1;
              uVar5 = uVar5 + 1;
            } while (uVar15 != 0);
            uVar8 = uVar8 + uVar9;
          }
        }
        if (uVar14 < mode->palettesize) {
          uVar13 = (int)uVar14 << 2;
          *buffer = mode->palette[uVar13];
          buffer[1] = mode->palette[(ulong)uVar13 + 1];
          buffer[2] = mode->palette[(ulong)uVar13 + 2];
          if (has_alpha != 0) {
            uVar6 = mode->palette[(ulong)uVar13 + 3];
LAB_00110011:
            buffer[3] = uVar6;
          }
        }
        else {
          buffer[2] = '\0';
          buffer[0] = '\0';
          buffer[1] = '\0';
          uVar6 = 0xff;
          if (has_alpha != 0) goto LAB_00110011;
        }
        sVar7 = sVar7 + 1;
        buffer = buffer + uVar4;
      } while (sVar7 != numpixels);
    }
    break;
  case LCT_GREY_ALPHA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar10 = buffer + 3;
        sVar7 = 0;
        do {
          uVar6 = in[sVar7 * 2];
          puVar10[-1] = uVar6;
          puVar10[-2] = uVar6;
          puVar10[-3] = uVar6;
          if (has_alpha != 0) {
            *puVar10 = in[sVar7 * 2 + 1];
          }
          sVar7 = sVar7 + 1;
          puVar10 = puVar10 + uVar4;
        } while (numpixels != sVar7);
      }
    }
    else if (numpixels != 0) {
      puVar10 = buffer + 3;
      sVar7 = 0;
      do {
        uVar6 = in[sVar7 * 4];
        puVar10[-1] = uVar6;
        puVar10[-2] = uVar6;
        puVar10[-3] = uVar6;
        if (has_alpha != 0) {
          *puVar10 = in[sVar7 * 4 + 2];
        }
        sVar7 = sVar7 + 1;
        puVar10 = puVar10 + uVar4;
      } while (numpixels != sVar7);
    }
    break;
  case LCT_RGBA:
    if (mode->bitdepth == 8) {
      if (numpixels != 0) {
        puVar10 = buffer + 3;
        sVar7 = 0;
        do {
          puVar10[-3] = in[sVar7 * 4];
          puVar10[-2] = in[sVar7 * 4 + 1];
          puVar10[-1] = in[sVar7 * 4 + 2];
          if (has_alpha != 0) {
            *puVar10 = in[sVar7 * 4 + 3];
          }
          sVar7 = sVar7 + 1;
          puVar10 = puVar10 + uVar4;
        } while (numpixels != sVar7);
      }
    }
    else if (numpixels != 0) {
      puVar10 = buffer + 3;
      sVar7 = 0;
      do {
        puVar10[-3] = in[sVar7 * 8];
        puVar10[-2] = in[sVar7 * 8 + 2];
        puVar10[-1] = in[sVar7 * 8 + 4];
        if (has_alpha != 0) {
          *puVar10 = in[sVar7 * 8 + 6];
        }
        sVar7 = sVar7 + 1;
        puVar10 = puVar10 + uVar4;
      } while (numpixels != sVar7);
    }
  }
  return;
}

Assistant:

static void getPixelColorsRGBA8(unsigned char* buffer, size_t numpixels,
	unsigned has_alpha, const unsigned char* in,
	const LodePNGColorMode* mode)
{
	unsigned num_channels = has_alpha ? 4 : 3;
	size_t i;
	if (mode->colortype == LCT_GREY)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i];
				if (has_alpha) buffer[3] = mode->key_defined && in[i] == mode->key_r ? 0 : 255;
			}
		}
		else if (mode->bitdepth == 16)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2];
				if (has_alpha) buffer[3] = mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r ? 0 : 255;
			}
		}
		else
		{
			unsigned highest = ((1U << mode->bitdepth) - 1U); /*highest possible value for this bit depth*/
			size_t j = 0;
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				unsigned value = readBitsFromReversedStream(&j, in, mode->bitdepth);
				buffer[0] = buffer[1] = buffer[2] = (value * 255) / highest;
				if (has_alpha) buffer[3] = mode->key_defined && value == mode->key_r ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_RGB)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 3 + 0];
				buffer[1] = in[i * 3 + 1];
				buffer[2] = in[i * 3 + 2];
				if (has_alpha) buffer[3] = mode->key_defined && buffer[0] == mode->key_r
					&& buffer[1] == mode->key_g && buffer[2] == mode->key_b ? 0 : 255;
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 6 + 0];
				buffer[1] = in[i * 6 + 2];
				buffer[2] = in[i * 6 + 4];
				if (has_alpha) buffer[3] = mode->key_defined
					&& 256U * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
					&& 256U * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
					&& 256U * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b ? 0 : 255;
			}
		}
	}
	else if (mode->colortype == LCT_PALETTE)
	{
		unsigned index;
		size_t j = 0;
		for (i = 0; i != numpixels; ++i, buffer += num_channels)
		{
			if (mode->bitdepth == 8) index = in[i];
			else index = readBitsFromReversedStream(&j, in, mode->bitdepth);

			if (index >= mode->palettesize)
			{
				/*This is an error according to the PNG spec, but most PNG decoders make it black instead.
				Done here too, slightly faster due to no error handling needed.*/
				buffer[0] = buffer[1] = buffer[2] = 0;
				if (has_alpha) buffer[3] = 255;
			}
			else
			{
				buffer[0] = mode->palette[index * 4 + 0];
				buffer[1] = mode->palette[index * 4 + 1];
				buffer[2] = mode->palette[index * 4 + 2];
				if (has_alpha) buffer[3] = mode->palette[index * 4 + 3];
			}
		}
	}
	else if (mode->colortype == LCT_GREY_ALPHA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 2 + 0];
				if (has_alpha) buffer[3] = in[i * 2 + 1];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = buffer[1] = buffer[2] = in[i * 4 + 0];
				if (has_alpha) buffer[3] = in[i * 4 + 2];
			}
		}
	}
	else if (mode->colortype == LCT_RGBA)
	{
		if (mode->bitdepth == 8)
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 4 + 0];
				buffer[1] = in[i * 4 + 1];
				buffer[2] = in[i * 4 + 2];
				if (has_alpha) buffer[3] = in[i * 4 + 3];
			}
		}
		else
		{
			for (i = 0; i != numpixels; ++i, buffer += num_channels)
			{
				buffer[0] = in[i * 8 + 0];
				buffer[1] = in[i * 8 + 2];
				buffer[2] = in[i * 8 + 4];
				if (has_alpha) buffer[3] = in[i * 8 + 6];
			}
		}
	}
}